

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

char duckdb::SignOperator::Operation<duckdb::hugeint_t,signed_char>(hugeint_t input)

{
  bool bVar1;
  byte bVar2;
  hugeint_t hStack_38;
  hugeint_t local_28;
  
  bVar2 = 0;
  hugeint_t::hugeint_t(&hStack_38,0);
  bVar1 = hugeint_t::operator==(&local_28,&hStack_38);
  if (!bVar1) {
    hugeint_t::hugeint_t(&hStack_38,0);
    bVar1 = hugeint_t::operator>(&local_28,&hStack_38);
    bVar2 = bVar1 - 1U | 1;
  }
  return bVar2;
}

Assistant:

static TR Operation(TA input) {
		if (input == TA(0)) {
			return 0;
		} else if (input > TA(0)) {
			return 1;
		} else {
			return -1;
		}
	}